

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

result_t benchmark_sum_dividers<unsigned_short,std::vector<libdivide::divider<unsigned_short,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)0>>>>
                   (vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
                    *dividers,size_t iters)

{
  result_t rVar1;
  unsigned_short uVar2;
  unsigned_short *puVar3;
  size_t sVar4;
  duration<double,_std::ratio<1L,_1L>_> *this;
  long in_RSI;
  rep_conflict rVar5;
  duration<double,_std::ratio<1L,_1L>_> seconds;
  time_point t2;
  unsigned_short numerator;
  size_t sum;
  time_point t1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb0;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffc8;
  unsigned_short uVar6;
  size_t sVar7;
  long local_20;
  
  std::chrono::_V2::system_clock::now();
  sVar7 = 0;
  for (local_20 = in_RSI; local_20 != 0; local_20 = local_20 + -1) {
    uVar6 = 2;
    uVar2 = (unsigned_short)local_20;
    puVar3 = std::max<unsigned_short>
                       ((unsigned_short *)&stack0xffffffffffffffcc,
                        (unsigned_short *)&stack0xffffffffffffffca);
    sVar4 = sum_dividers<unsigned_short,std::vector<libdivide::divider<unsigned_short,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)0>>>>
                      ((unsigned_short)(sVar7 >> 0x30),
                       (vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
                        *)CONCAT26(*puVar3,CONCAT24(uVar6,CONCAT22(uVar2,in_stack_ffffffffffffffc8))
                                  ));
    sVar7 = sVar4 + sVar7;
  }
  this = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffffb8.__r,in_stack_ffffffffffffffb0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (this,(duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffb8.__r);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffb8);
  rVar1.sum = sVar7;
  rVar1.duration = rVar5;
  return rVar1;
}

Assistant:

NOINLINE result_t benchmark_sum_dividers(const D& dividers, size_t iters) {
    auto t1 = std::chrono::system_clock::now();
    size_t sum = 0;

    for (; iters > 0; iters--) {
        // Unsigned branchfree divider cannot be 1
        T numerator = std::max((T)2, (T)iters);
        sum += sum_dividers(numerator, dividers);
    }

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    return result_t{seconds.count(), sum};
}